

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffnd(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  ushort uVar2;
  ushort *puVar3;
  undefined8 uVar4;
  anon_union_8_4_1dda36f5_for_runsv aVar5;
  undefined2 uVar6;
  int iVar7;
  uint uVar8;
  runcxdef *prVar9;
  runsdef *prVar10;
  int iVar11;
  dattyp typ;
  size_t __n;
  uint uVar12;
  ushort *puVar13;
  runsdef val;
  
  prVar9 = ctx->bifcxrun;
  uVar1 = prVar9->runcxsp[-1].runstyp;
  prVar10 = prVar9->runcxsp + -1;
  if (uVar1 == '\a') {
    prVar9->runcxsp = prVar10;
    prVar9 = ctx->bifcxrun;
    if (prVar10->runstyp != '\a') {
      prVar9->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    prVar10 = prVar9->runcxsp;
    uVar2 = *(ushort *)(prVar10->runsv).runsvstr;
    puVar13 = (ushort *)((long)(prVar10->runsv).runsvstr + 2);
    prVar9->runcxsp = prVar10 + -1;
    uVar4._0_1_ = prVar10[-1].runstyp;
    uVar4._1_7_ = *(undefined7 *)&prVar10[-1].field_0x1;
    aVar5 = prVar10[-1].runsv;
    val.runsv.runsvobj = aVar5._0_2_;
    uVar6 = val.runsv.runsvobj;
    uVar12 = 1;
    val._0_8_ = uVar4;
    val.runsv = aVar5;
    for (iVar11 = uVar2 - 2; iVar11 != 0; iVar11 = iVar11 - (uVar8 + 1)) {
      puVar3 = (ushort *)((long)puVar13 + 1);
      uVar8 = datsiz((uint)(byte)*puVar13,puVar3);
      if ((uchar)uVar4 == (byte)*puVar13) {
        switch((uchar)uVar4) {
        case '\x01':
          if ((ushort *)aVar5.runsvnum != (ushort *)(long)*(int *)puVar3) goto LAB_0012262d;
          break;
        case '\x02':
        case '\n':
        case '\r':
          if (*puVar3 != uVar6) goto LAB_0012262d;
          break;
        case '\x03':
        case '\a':
          if ((*puVar3 != *(ushort *)aVar5.runsvstr) ||
             (iVar7 = bcmp((byte *)((long)puVar13 + 3),(ushort *)(aVar5.runsvnum + 2),
                           (ulong)*puVar3 - 2), iVar7 != 0)) goto LAB_0012262d;
        }
        typ = 1;
        goto LAB_0012264f;
      }
LAB_0012262d:
      uVar12 = uVar12 + 1;
      puVar13 = (ushort *)((long)puVar13 + (long)(int)(uVar8 + 1));
    }
    typ = 5;
LAB_0012264f:
    prVar9 = ctx->bifcxrun;
LAB_00122659:
    val.runsv.runsvnum._4_4_ = 0;
    val.runsv.runsvnum._0_4_ = uVar12;
    runpush(prVar9,typ,&val);
    return;
  }
  if (uVar1 != '\x03') {
    prVar9->runcxerr->errcxptr->erraav[0].errastr = "find";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar9->runcxsp = prVar10;
  prVar9 = ctx->bifcxrun;
  if (prVar10->runstyp == '\x03') {
    prVar10 = prVar9->runcxsp;
    puVar13 = (ushort *)(prVar10->runsv).runsvstr;
    uVar2 = *puVar13;
    prVar9->runcxsp = prVar10 + -1;
    if (prVar10[-1].runstyp == '\x03') {
      puVar13 = puVar13 + 1;
      prVar9 = ctx->bifcxrun;
      puVar3 = (ushort *)(prVar9->runcxsp->runsv).runsvstr;
      __n = (ulong)*puVar3 - 2;
      uVar12 = 1;
      for (iVar11 = uVar2 - 2; (int)__n <= iVar11; iVar11 = iVar11 + -1) {
        iVar7 = bcmp(puVar13,puVar3 + 1,__n);
        if (iVar7 == 0) {
          typ = 1;
          goto LAB_00122659;
        }
        puVar13 = (ushort *)((long)puVar13 + 1);
        uVar12 = uVar12 + 1;
      }
      typ = 5;
      goto LAB_00122659;
    }
    prVar9 = ctx->bifcxrun;
  }
  prVar9->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void biffnd(bifcxdef *ctx, int argc)
{
    uchar   *p1, *p2;
    int      len1, len2;
    int      outv;
    runsdef  val;
    int      typ;
    int      siz;
    
    bifcntargs(ctx, 2, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p1 = runpopstr(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;
        
        p2 = runpopstr(ctx->bifcxrun);
        len2 = osrp2(p2) - 2;
        p2 += 2;

        /* look for p2 within p1 */
        for (typ = DAT_NIL, outv = 1 ; len1 >= len2 ; ++p1, --len1, ++outv)
        {
            if (!memcmp(p1, p2, (size_t)len2))
            {
                typ = DAT_NUMBER;           /* use number in outv after all */
                break;                        /* that's it - we've found it */
            }
        }
        break;
        
    case DAT_LIST:
        p1 = runpoplst(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;

        /* get second item:  any old datatype */
        runpop(ctx->bifcxrun, &val);
        
        for (typ = DAT_NIL, outv = 1 ; len1 ; ++outv, p1 += siz, len1 -= siz)
        {
            siz = datsiz(*p1, p1 + 1) + 1;      /* get size of this element */
            if (val.runstyp != *p1) continue;          /* types don't match */
            
            switch(val.runstyp)
            {
            case DAT_NUMBER:
                if (val.runsv.runsvnum != osrp4s(p1 + 1)) continue;
                break;
                
            case DAT_SSTRING:
            case DAT_LIST:
                if (osrp2(p1 + 1) != osrp2(val.runsv.runsvstr) ||
                    memcmp(p1 + 3, val.runsv.runsvstr + 2,
                           (size_t)(osrp2(p1 + 1) - 2)))
                    continue;
                break;
                
            case DAT_PROPNUM:
                if (osrp2(p1 + 1) != val.runsv.runsvprp) continue;
                break;
                
            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(p1 + 1) != val.runsv.runsvobj) continue;
                break;
                
            default:
                break;
            }
            
            /* if we got here, it means we found a match */
            typ = DAT_NUMBER;                      /* use the value in outv */
            break;                            /* that's it - we've found it */
        }
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "find");
    }
    
    /* push the value given by typ and outv */
    val.runsv.runsvnum = outv;
    runpush(ctx->bifcxrun, typ, &val);
}